

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_checkstack(lua_State *L,int n)

{
  CallInfo *pCVar1;
  int *piVar2;
  uint __line;
  int iVar3;
  StkId pTVar4;
  int iVar5;
  char *__assertion;
  int n_local;
  
  pCVar1 = L->ci;
  iVar5 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar5 + 1;
  n_local = n;
  if (iVar5 != 0) {
    __assertion = 
    "(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0";
    __line = 0x69;
    goto LAB_0011e753;
  }
  if (n < 0) {
    __assertion = "(n >= 0) && \"negative \'n\'\"";
    __line = 0x6a;
    goto LAB_0011e753;
  }
  pTVar4 = L->top;
  if ((long)(ulong)(uint)n < (long)L->stack_last - (long)pTVar4 >> 4) {
LAB_0011e6a4:
    iVar5 = 1;
    if (pCVar1->top < pTVar4 + n_local) {
      pCVar1->top = pTVar4 + n_local;
    }
  }
  else {
    iVar5 = 0;
    if ((int)((ulong)((long)pTVar4 - (long)L->stack) >> 4) + 5 <= 1000000 - n) {
      iVar3 = luaD_rawrunprotected(L,growstack,&n_local);
      if (iVar3 == 0) {
        pTVar4 = L->top;
        goto LAB_0011e6a4;
      }
    }
  }
  piVar2 = *(int **)&L[-1].hookmask;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    return iVar5;
  }
  __assertion = 
  "--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0";
  __line = 0x76;
LAB_0011e753:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,__line,"int lua_checkstack(lua_State *, int)");
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int n) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  api_check(L, n >= 0, "negative 'n'");
  if (L->stack_last - L->top > n)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - n)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &n) == LUA_OK);
  }
  if (res && ci->top < L->top + n)
    ci->top = L->top + n;  /* adjust frame top */
  lua_unlock(L);
  return res;
}